

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O2

void __thiscall
QPDFParser::addScalar<QPDF_Name,std::__cxx11::string_const&>
          (QPDFParser *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  StackFrame *pSVar1;
  QPDF *qpdf_p;
  qpdf_offset_t offset;
  shared_ptr<QPDFObject> obj;
  shared_ptr<QPDFObject> local_28;
  
  if (((this->bad_count == 0) && (this->sanity_checks != true)) ||
     ((pSVar1 = this->frame,
      (ulong)((long)(pSVar1->olist).
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(pSVar1->olist).
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                   super__Vector_impl_data._M_start) < 0x13881 &&
      ((pSVar1->dict)._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x1389)))) {
    QPDFObject::create<QPDF_Name,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
    qpdf_p = this->context;
    offset = InputSource::getLastOffset(this->input);
    QPDFObject::setDescription
              (local_28.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,qpdf_p,
               &this->description,offset);
    add(this,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    this->max_bad_count = 0;
  }
  return;
}

Assistant:

void
QPDFParser::addScalar(Args&&... args)
{
    if ((bad_count || sanity_checks) &&
        (frame->olist.size() > 5'000 || frame->dict.size() > 5'000)) {
        // Stop adding scalars. We are going to abort when the close token or a bad token is
        // encountered.
        max_bad_count = 0;
        return;
    }
    auto obj = QPDFObject::create<T>(std::forward<Args>(args)...);
    obj->setDescription(context, description, input.getLastOffset());
    add(std::move(obj));
}